

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O2

bool __thiscall xray_re::xr_ini_file::line_exist(xr_ini_file *this,char *sname,char *lname)

{
  ini_section *this_00;
  bool bVar1;
  int iVar2;
  __normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
  _Var3;
  
  _Var3 = lower_bound_if<__gnu_cxx::__normal_iterator<xray_re::xr_ini_file::ini_section*const*,std::vector<xray_re::xr_ini_file::ini_section*,std::allocator<xray_re::xr_ini_file::ini_section*>>>,xray_re::xr_ini_file::ini_section_pred>
                    ((__normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
                      )(this->m_sections).
                       super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
                      )(this->m_sections).
                       super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(ini_section_pred)sname);
  if (_Var3._M_current !=
      (this->m_sections).
      super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = *_Var3._M_current;
    iVar2 = strcasecmp((this_00->name)._M_dataplus._M_p,sname);
    if (iVar2 == 0) {
      bVar1 = ini_section::line_exist(this_00,lname,(char **)0x0);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool xr_ini_file::line_exist(const char* sname, const char* lname) const
{
	ini_section_vec_cit it = lower_bound_if(m_sections.begin(), m_sections.end(), ini_section_pred(sname));
	if (it == m_sections.end() || xr_stricmp((*it)->name.c_str(), sname) != 0)
		return false;
	return (*it)->line_exist(lname, 0);
}